

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     dec<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (modify_t<unsigned_short> destination,Context *context)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  Context *context_local;
  modify_t<unsigned_short> destination_local;
  
  uVar1 = *destination;
  uVar2 = Numeric::top_bit<unsigned_short>();
  Flags::set_from<(InstructionSet::x86::Flag)3>(&context->flags,(uint)(uVar1 == uVar2));
  *destination = *destination - 1;
  Flags::
  set_from<unsigned_short,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,*destination);
  Flags::set_from<(InstructionSet::x86::Flag)1>
            (&context->flags,(*destination + 1 ^ (uint)*destination) & 0x10);
  return;
}

Assistant:

void dec(
	modify_t<IntT> destination,
	ContextT &context
) {
	/*
		DEST ← DEST - 1;
	*/
	/*
		The CF flag is not affected.
		The OF, SF, ZF, AF, and PF flags are set according to the result.
	*/
	context.flags.template set_from<Flag::Overflow>(destination == Numeric::top_bit<IntT>());

	--destination;

	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(destination);
	context.flags.template set_from<Flag::AuxiliaryCarry>(((destination + 1) ^ destination) & 0x10);
}